

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O2

void __thiscall Sexp::Dump(Sexp *this,ostream *stream)

{
  Sexp *this_00;
  Sexp *this_01;
  
  if (this->kind != CONS) {
    DumpAtom(this,stream);
    return;
  }
  std::operator<<(stream,"(");
  this_00 = (this->field_1).cons.car;
  this_01 = (this->field_1).cons.cdr;
  while( true ) {
    if (this_00 == (Sexp *)0x0) {
      __assert_fail("car != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
                    ,0x91,"void Sexp::Dump(std::ostream &) const");
    }
    if (this_01 == (Sexp *)0x0) break;
    Dump(this_00,stream);
    if (this_01->kind != CONS) {
      if (this_01->kind != EMPTY) {
        std::operator<<(stream," . ");
        Dump(this_01,stream);
      }
      std::operator<<(stream,")");
      return;
    }
    this_00 = (this_01->field_1).cons.car;
    this_01 = (this_01->field_1).cons.cdr;
    std::operator<<(stream," ");
  }
  __assert_fail("cdr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
                ,0x92,"void Sexp::Dump(std::ostream &) const");
}

Assistant:

void Sexp::Dump(std::ostream &stream) const {
  // Simple algorithm for pretty-printing an S-expression.
  // The algorithm goes like this:
  // 1) If self isn't a list, print it and return.
  // 2) If self is a list, print an open paren.
  //   2a) Print the car of the list.
  //   2b) If cdr is a list, recurse to step 2a with cdr as the new list
  //   2c) If cdr is (), print nothing,
  //   2d) If cdr is anything else, print a "." followed by a space
  //       and recursively print the cdr.
  if (!IsCons()) {
    DumpAtom(stream);
    return;
  }

  stream << "(";
  Sexp *car = this->cons.car;
  Sexp *cdr = this->cons.cdr;
  while (1) {
    assert(car != nullptr);
    assert(cdr != nullptr);
    car->Dump(stream);
    if (cdr->IsEmpty()) {
      break;
    }

    if (cdr->IsCons()) {
      car = cdr->cons.car;
      cdr = cdr->cons.cdr;
      stream << " ";
      continue;
    }

    stream << " . ";
    cdr->Dump(stream);
    break;
  }

  stream << ")";
}